

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verstring.c
# Opt level: O1

int ssh_versioncmp(char *a,char *b)

{
  ulong uVar1;
  ulong uVar2;
  char *be;
  char *ae;
  char *local_20;
  char *local_18;
  
  uVar1 = strtoul(a,&local_18,10);
  uVar2 = strtoul(b,&local_20,10);
  if (uVar1 == uVar2) {
    if (*local_18 == '.') {
      local_18 = local_18 + 1;
    }
    if (*local_20 == '.') {
      local_20 = local_20 + 1;
    }
    uVar1 = strtoul(local_18,&local_18,10);
    uVar2 = strtoul(local_20,&local_20,10);
    if (uVar1 == uVar2) {
      return 0;
    }
  }
  return -(uint)(uVar1 < uVar2) | 1;
}

Assistant:

static int ssh_versioncmp(const char *a, const char *b)
{
    char *ae, *be;
    unsigned long av, bv;

    av = strtoul(a, &ae, 10);
    bv = strtoul(b, &be, 10);
    if (av != bv)
        return (av < bv ? -1 : +1);
    if (*ae == '.')
        ae++;
    if (*be == '.')
        be++;
    av = strtoul(ae, &ae, 10);
    bv = strtoul(be, &be, 10);
    if (av != bv)
        return (av < bv ? -1 : +1);
    return 0;
}